

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc-time.c
# Opt level: O0

uint64_t rtosc_float2secfracs(float secfracsf)

{
  int iVar1;
  char *pcVar2;
  float in_XMM0_Da;
  int lshift;
  int hexdigits_after_comma;
  char *p;
  int scanned;
  char *plus;
  int exp;
  uint64_t secfracs;
  int scanpos;
  int written;
  char secfracs_as_hex [32];
  undefined4 local_3c;
  long local_38;
  char cVar3;
  undefined4 in_stack_ffffffffffffffd0;
  char local_28 [40];
  
  iVar1 = snprintf(local_28,0x20,"%a",(double)in_XMM0_Da);
  remove_trailing_zeroes((char *)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
  if (local_28[3] == '.') {
    local_28[3] = local_28[2];
    iVar1 = 3;
  }
  else {
    iVar1 = 2;
  }
  pcVar2 = strstr(local_28,"+0");
  if ((pcVar2 == (char *)0x0) || (pcVar2[2] != '\0')) {
    __isoc99_sscanf(local_28 + iVar1,"%lxp-%i",&local_38,&local_3c);
  }
  else {
    local_3c = 0;
    local_38 = 0;
  }
  cVar3 = (char)iVar1;
  pcVar2 = strchr(local_28,0x70);
  return local_38 <<
         ((' ' - (char)local_3c) + ((char)pcVar2 - ((char)local_28 + cVar3 + '\x01')) * -4 & 0x3fU);
}

Assistant:

uint64_t rtosc_float2secfracs(float secfracsf)
{
    char secfracs_as_hex[32];
    // print float in hex representation (lossless)
    int written = snprintf(secfracs_as_hex, 32, "%a", secfracsf);
    // examples:
    // 0.85 => 0x1.b33334p-1
    // 0.51 => 0x1.051eb8p-1
    // 0.5  => 0x8p-4
    remove_trailing_zeroes(secfracs_as_hex);

    assert(written >= 0); // no error
    assert(written < (int)sizeof(secfracs_as_hex)); // size suffices
    (void) written;
    int scanpos;
    if(secfracs_as_hex[3]=='.') // 0x?.???
    {
        secfracs_as_hex[3] = secfracs_as_hex[2]; // remove '.'
        scanpos = 3;
    }
    else
    {
        scanpos = 2;
    }
    uint64_t secfracs;
    int exp;
    const char* plus;
    if((plus = strstr(secfracs_as_hex, "+0")) && !plus[2])
    {
        // exponent with plus sign, does not match the scanf below
        secfracs = exp = 0;
    }
    else
    {
        int scanned = sscanf(secfracs_as_hex + scanpos,
                             "%"PRIx64"p-%i" /* expands to like "%lxp-%i" */,
                             &secfracs, &exp);
#ifdef NDEBUG
        (void)scanned;
#else
        assert(scanned == 2);
#endif
    }
    const char* p = strchr(secfracs_as_hex, 'p');
    assert(p);
    int hexdigits_after_comma = p-(secfracs_as_hex+scanpos+1);

    /*
       Remember that
       (1) shifting a comma over one hex digits multiplies/divides by 4
       (2) that secfracsf was scanned as "%a"
       (3) 0x00000001 counts as one secfrac and 0x100000000 would equal 1,
           which means one secfrac is 2^-32
       Then, we get:
                      base_without_comma*2^(-exp-4*hexdigits_after_comma)
       (with (1))   = base_with_comma*2^-exp
       (with (2))   = secfracsf
       (with (3))   = secfracs*2^-32
       <=> secfracs = base_without_comma * 2^(32-exp-4*hexdigits_after_comma)
    */
    int lshift = 32-exp-(hexdigits_after_comma<<2);
    assert(lshift > 0);
    secfracs <<= lshift;
    assert((secfracs & 0xFFFFFFFF) == secfracs);

    return secfracs;
}